

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Le
          (PortalImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Point2f uv_00;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Vector3f wRender;
  SampledSpectrum SVar9;
  optional<pbrt::Point2<float>_> uv;
  optional<pbrt::Bounds2<float>_> b;
  undefined1 local_38 [16];
  float local_28;
  float local_24;
  float local_20;
  char local_1c;
  
  fVar5 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar3 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_4_ = (float)uVar1 * (float)uVar1;
  auVar6._4_4_ = (float)uVar3 * (float)uVar3;
  auVar6._8_8_ = 0;
  auVar7 = vmovshdup_avx(auVar6);
  fVar5 = fVar5 * fVar5 + auVar6._0_4_ + auVar7._0_4_;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    auVar7 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
    fVar5 = auVar7._0_4_;
  }
  uVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar7._4_4_ = uVar4;
  auVar7._0_4_ = uVar2;
  auVar7._8_8_ = 0;
  auVar8._4_4_ = fVar5;
  auVar8._0_4_ = fVar5;
  auVar8._8_4_ = fVar5;
  auVar8._12_4_ = fVar5;
  auVar7 = vdivps_avx(auVar7,auVar8);
  wRender.super_Tuple3<pbrt::Vector3,_float>.z =
       (ray->d).super_Tuple3<pbrt::Vector3,_float>.z / fVar5;
  wRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar7._0_8_;
  ImageFromRender((PortalImageInfiniteLight *)local_38,wRender,(Float *)this);
  ImageBounds((optional<pbrt::Bounds2<float>_> *)(local_38 + 0xc),this,&ray->o);
  if ((((local_38[8] != '\x01') || (local_1c != '\x01')) ||
      ((float)local_38._0_4_ < (float)local_38._12_4_)) ||
     ((local_24 < (float)local_38._0_4_ || ((float)local_38._4_4_ < local_28)))) {
    SVar9.values.values = (array<float,_4>)ZEXT816(0);
  }
  else {
    SVar9.values.values = (array<float,_4>)ZEXT816(0);
    if ((float)local_38._4_4_ <= local_20) {
      uv_00.super_Tuple2<pbrt::Point2,_float>.y = (float)local_38._4_4_;
      uv_00.super_Tuple2<pbrt::Point2,_float>.x = (float)local_38._0_4_;
      SVar9 = ImageLookup(this,uv_00,lambda);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar9;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Le(const Ray &ray,
                                             const SampledWavelengths &lambda) const {
    pstd::optional<Point2f> uv = ImageFromRender(Normalize(ray.d));
    pstd::optional<Bounds2f> b = ImageBounds(ray.o);
    if (!uv || !b || !Inside(*uv, *b))
        return SampledSpectrum(0.f);
    return ImageLookup(*uv, lambda);
}